

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall MXNetNode::attr_af(MXNetNode *this,char *key)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  vector<float,_std::allocator<float>_> *in_RDI;
  int nscan;
  int nconsumed;
  int c;
  float i;
  const_iterator it;
  vector<float,_std::allocator<float>_> *list;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff48;
  vector<float,_std::allocator<float>_> *this_00;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  undefined4 local_68;
  undefined1 local_61;
  _Self local_60 [3];
  allocator<char> local_41;
  string local_40 [32];
  _Self local_20 [4];
  
  __a = &local_41;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),__a);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff48,(key_type *)0x102e13);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff48);
  bVar1 = std::operator==(local_20,local_60);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x102e81);
  }
  else {
    local_61 = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x102ecc);
    local_68 = 0;
    iVar5 = 0;
    iVar4 = 0;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x102ef2);
    lVar3 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(lVar3 + iVar5,"%*[(,]%f%n",&local_68,&stack0xffffffffffffff90);
    while (iVar2 == 1) {
      std::vector<float,_std::allocator<float>_>::push_back(this_00,(value_type_conflict2 *)in_RDI);
      local_68 = 0;
      iVar5 = iVar4 + iVar5;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x102f63);
      lVar3 = std::__cxx11::string::c_str();
      iVar2 = __isoc99_sscanf(lVar3 + iVar5,"%*[(,]%f%n",&local_68,&stack0xffffffffffffff90);
    }
  }
  return this_00;
}

Assistant:

std::vector<float> MXNetNode::attr_af(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<float>();

    // (0.1,0.2,0.3)
    std::vector<float> list;

    float i = 0.f;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[(,]%f%n", &i, &nconsumed);
    while (nscan == 1)
    {
        list.push_back(i);
//         fprintf(stderr, "%f\n", i);

        i = 0.f;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%f%n", &i, &nconsumed);
    }

    return list;
}